

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

int __thiscall QTabBarPrivate::calculateNewPosition(QTabBarPrivate *this,int from,int to,int index)

{
  int iVar1;
  int *piVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  int end;
  int start;
  int local_24;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = in_EDX;
  if (in_ECX != in_ESI) {
    local_10 = in_EDX;
    local_c = in_ESI;
    piVar2 = qMin<int>(&local_c,&local_10);
    iVar1 = *piVar2;
    piVar2 = qMax<int>(&local_c,&local_10);
    local_24 = in_ECX;
    if ((iVar1 <= in_ECX) && (in_ECX <= *piVar2)) {
      local_24 = 1;
      if (local_c < local_10) {
        local_24 = -1;
      }
      local_24 = local_24 + in_ECX;
    }
    local_14 = local_24;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

int QTabBarPrivate::calculateNewPosition(int from, int to, int index) const
{
    if (index == from)
        return to;

    int start = qMin(from, to);
    int end = qMax(from, to);
    if (index >= start && index <= end)
        index += (from < to) ? -1 : 1;
    return index;
}